

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_message.c
# Opt level: O0

_Bool ContainsValidUsAscii(char *asciiValue)

{
  bool bVar1;
  char *local_20;
  char *iterator;
  _Bool result;
  char *asciiValue_local;
  
  local_20 = asciiValue;
  while( true ) {
    bVar1 = false;
    if (local_20 != (char *)0x0) {
      bVar1 = *local_20 != '\0';
    }
    if (!bVar1) break;
    if ((*local_20 < ' ') || ('~' < *local_20)) {
      return false;
    }
    local_20 = local_20 + 1;
  }
  return true;
}

Assistant:

static bool ContainsValidUsAscii(const char* asciiValue)
{
    bool result = true;
    const char* iterator = asciiValue;
    while (iterator != NULL && *iterator != '\0')
    {
        // Union of all allowed ASCII characters for the different protocols (HTTPS, MQTT, AMQP) is [dec 32, dec 126].
        if (*iterator < ' ' || *iterator > '~')
        {
            result = false;
            break;
        }
        iterator++;
    }

    return result;
}